

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall
QMimeXMLProvider::addAliases(QMimeXMLProvider *this,QString *name,QStringList *result)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<const_QString_&,_const_QString_&> pVar2;
  piter local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (piter)QHash<QString,_QString>::begin(&this->m_aliases);
  while ((local_38.d != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 || (local_38.bucket != 0)
         )) {
    pVar2 = QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator>
            ::operator*((QKeyValueIterator<const_QString_&,_const_QString_&,_QHash<QString,_QString>::const_iterator>
                         *)&local_38);
    bVar1 = ::comparesEqual(pVar2.second,name);
    if (bVar1) {
      appendIfNew(result,pVar2.first);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QString>_>::operator++(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addAliases(const QString &name, QStringList &result)
{
    // Iterate through the whole hash. This method is rarely used.
    for (const auto &[alias, mimeName] : std::as_const(m_aliases).asKeyValueRange()) {
        if (mimeName == name)
            appendIfNew(result, alias);
    }
}